

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O2

QMenuBar * __thiscall MenuBar::createMenuBar(MenuBar *this,QMainWindow *mainWindow)

{
  QMenu *this_00;
  mapped_type *pmVar1;
  QMenuBar *this_01;
  QArrayDataPointer<char16_t> local_40;
  
  this_00 = (QMenu *)operator_new(0x28);
  QString::QString((QString *)&local_40,"File");
  QMenu::QMenu(this_00,(QString *)&local_40,(QWidget *)mainWindow);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QString::QString((QString *)&local_40,"padding-left:10px;");
  QWidget::setStyleSheet((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  local_40.d._0_4_ = 2;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,(key_type *)&local_40);
  QWidget::addAction((QAction *)this_00);
  QMenu::addSeparator();
  local_40.d._0_4_ = 3;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,(key_type *)&local_40);
  QWidget::addAction((QAction *)this_00);
  local_40.d._0_4_ = 3;
  pmVar1 = std::
           map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
           ::at(&this->mapAction,(key_type *)&local_40);
  QAction::setEnabled(SUB81(pmVar1,0));
  QMenu::addSeparator();
  local_40.d._0_4_ = 4;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,(key_type *)&local_40);
  QWidget::addAction((QAction *)this_00);
  QMenu::addSeparator();
  local_40.d._0_4_ = 1;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,(key_type *)&local_40);
  QWidget::addAction((QAction *)this_00);
  this_01 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_01,(QWidget *)mainWindow);
  QMenuBar::addMenu((QMenu *)this_01);
  local_40.d._0_4_ = 5;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,(key_type *)&local_40);
  QWidget::addAction((QAction *)this_01);
  local_40.d._0_4_ = 0;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,(key_type *)&local_40);
  QWidget::addAction((QAction *)this_01);
  QString::QString((QString *)&local_40,"padding-left: 5px; margin: 3px;");
  QWidget::setStyleSheet((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  return this_01;
}

Assistant:

QMenuBar* MenuBar::createMenuBar( QMainWindow* mainWindow )
{
    QMenu* fileMenu = new QMenu( "File", mainWindow );
    fileMenu->setStyleSheet( "padding-left:10px;" );

    using enum ActionMenu;
    fileMenu->addAction( &mapAction.at( OPEN_GRAPHIC ));
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( REM_GRAPHIC ));
    mapAction.at( REM_GRAPHIC ).setEnabled( false );
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( SAVE_BOARD ));
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( LOAD_BOARD ));

    QMenuBar* menuBar = new QMenuBar( mainWindow );
    menuBar->addMenu( fileMenu );
    menuBar->addAction( &mapAction.at( SETTINGS ));
    menuBar->addAction( &mapAction.at( ABOUT ));
    menuBar->setStyleSheet( "padding-left: 5px; margin: 3px;" );
    return menuBar;
}